

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O2

void __thiscall antlr::BitSet::BitSet(BitSet *this,unsigned_long *bits_,uint nlongs)

{
  unsigned_long uVar1;
  ulong *puVar2;
  ulong uVar3;
  uint i;
  ulong __n;
  reference rVar4;
  allocator_type local_29;
  
  std::vector<bool,_std::allocator<bool>_>::vector(&this->storage,(ulong)(nlongs << 5),&local_29);
  for (__n = 0; nlongs << 5 != __n; __n = __n + 1) {
    uVar1 = bits_[__n >> 5 & 0x7ffffff];
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->storage,__n);
    puVar2 = rVar4._M_p;
    if (((uint)uVar1 >> ((uint)__n & 0x1f) & 1) == 0) {
      uVar3 = ~rVar4._M_mask & *puVar2;
    }
    else {
      uVar3 = rVar4._M_mask | *puVar2;
    }
    *puVar2 = uVar3;
  }
  return;
}

Assistant:

BitSet::BitSet( const unsigned long* bits_, unsigned int nlongs )
: storage(nlongs*32)
{
	for ( unsigned int i = 0 ; i < (nlongs * 32); i++)
		storage[i] = (bits_[i>>5] & (1UL << (i&31))) ? true : false;
}